

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O0

void OpenSteer::OpenSteerDemo::popPhase(void)

{
  updatePhaseTimers();
  phaseStackIndex = phaseStackIndex + -1;
  phase = phaseStack[phaseStackIndex];
  updatePhaseActive = phase == 1;
  drawPhaseActive = phase == 2;
  return;
}

Assistant:

void 
OpenSteer::OpenSteerDemo::popPhase (void)
{
    // update timer for current (old) phase: add in time since last switch
    updatePhaseTimers ();

    // restore old phase
    phase = phaseStack[--phaseStackIndex];
    updatePhaseActive = phase == OpenSteer::OpenSteerDemo::updatePhase;
    drawPhaseActive = phase == OpenSteer::OpenSteerDemo::drawPhase;
}